

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqlitePagerRollback(Pager *pPager,int bResetKvEngine)

{
  sxi32 *psVar1;
  unqlite_kv_engine *puVar2;
  Page *pPVar3;
  unqlite_kv_io *puVar4;
  _func_void_unqlite_kv_engine_ptr *p_Var5;
  _func_int_unqlite_kv_engine_ptr_int *p_Var6;
  _func_int_unqlite_kv_engine_ptr_pgno *p_Var7;
  unqlite *pDb;
  unqlite_file *puVar8;
  SyMemBackend *pBackend;
  Page *pPage;
  int iVar9;
  Page **ppPVar10;
  ulong uVar11;
  unqlite_kv_engine *puVar12;
  uint uVar13;
  Page **ppPVar14;
  unqlite_kv_engine *puVar15;
  unqlite_kv_engine *puVar16;
  int iVar17;
  
  if (pPager->iState < 2) {
    return 0;
  }
  if (pPager->is_mem != 0) {
    return 0;
  }
  if (pPager->is_rdonly != 0) {
    unqliteGenError(pPager->pDb,"Read-Only database");
    return -0x4b;
  }
  if (pPager->iState == 2) {
    if (pPager->iLock != 0) {
      (*pPager->pfd->pMethods->xUnlock)(pPager->pfd,1);
      pPager->iLock = 1;
    }
    pPager->iState = 1;
    return 0;
  }
  if (pPager->no_jrnl == 0) {
    puVar8 = pPager->pjfd;
    if (puVar8 != (unqlite_file *)0x0) {
      (*puVar8->pMethods->xSync)(puVar8,2);
    }
    puVar8 = pPager->pjfd;
    if (puVar8 != (unqlite_file *)0x0) {
      pBackend = pPager->pAllocator;
      (*puVar8->pMethods->xClose)(puVar8);
      SyMemBackendFree(pBackend,puVar8);
    }
    pPager->pjfd = (unqlite_file *)0x0;
    if (((pPager->iFlags & 3) != 0) && (iVar9 = pager_journal_rollback(pPager,0), iVar9 != 0)) {
      psVar1 = &pPager->pDb->iFlags;
      *psVar1 = *psVar1 | 1;
      return iVar9;
    }
  }
  (*pPager->pVfs->xDelete)(pPager->pVfs,pPager->zJournal,1);
  puVar2 = pPager->pEngine;
  *(byte *)&pPager->iFlags = (byte)pPager->iFlags & 0xfc;
  pPager->iJournalOfft = 0;
  pPager->nRec = 0;
  pPager->dbSize = pPager->dbOrigSize;
  pPage = pPager->pAll;
  while (pPage != (Page *)0x0) {
    pPVar3 = pPage->pNext;
    *(byte *)&pPage->flags = (byte)pPage->flags & 0x91;
    pager_release_page(pPager,pPage);
    pPage = pPVar3;
  }
  pPager->nPage = 0;
  pPager->pFirstDirty = (Page *)0x0;
  pPager->pDirty = (Page *)0x0;
  pPager->pAll = (Page *)0x0;
  pPager->pHotDirty = (Page *)0x0;
  *(undefined8 *)((long)&pPager->pHotDirty + 4) = 0;
  *(undefined8 *)((long)&pPager->pFirstHot + 4) = 0;
  ppPVar10 = pPager->apHash;
  if ((ppPVar10 != (Page **)0x0) && (uVar13 = pPager->nSize << 3, uVar13 != 0)) {
    ppPVar14 = (Page **)((ulong)uVar13 + (long)ppPVar10);
    do {
      *(undefined1 *)ppPVar10 = 0;
      if (ppPVar14 <= (Page **)((long)ppPVar10 + 1)) break;
      *(undefined1 *)((long)ppPVar10 + 1) = 0;
      if (ppPVar14 <= (Page **)((long)ppPVar10 + 2)) break;
      *(undefined1 *)((long)ppPVar10 + 2) = 0;
      if (ppPVar14 <= (Page **)((long)ppPVar10 + 3)) break;
      *(undefined1 *)((long)ppPVar10 + 3) = 0;
      ppPVar10 = (Page **)((long)ppPVar10 + 4);
    } while (ppPVar10 < ppPVar14);
  }
  if (pPager->pVec != (Bitvec *)0x0) {
    unqliteBitvecDestroy(pPager->pVec);
    pPager->pVec = (Bitvec *)0x0;
  }
  if (pPager->iLock != 0) {
    (*pPager->pfd->pMethods->xUnlock)(pPager->pfd,1);
    pPager->iLock = 1;
  }
  pPager->iState = 1;
  if (bResetKvEngine != 0) {
    puVar4 = puVar2->pIo;
    p_Var5 = puVar4->pMethods->xRelease;
    if (p_Var5 != (_func_void_unqlite_kv_engine_ptr *)0x0) {
      (*p_Var5)(puVar2);
    }
    uVar11 = (ulong)(uint)puVar4->pMethods->szKv;
    if (uVar11 != 0) {
      puVar12 = (unqlite_kv_engine *)((long)&puVar2->pIo + uVar11);
      puVar15 = puVar2;
      do {
        *(undefined1 *)&puVar15->pIo = 0;
        puVar16 = (unqlite_kv_engine *)((long)&puVar15->pIo + 1);
        if (puVar12 <= puVar16) break;
        *(undefined1 *)&puVar16->pIo = 0;
        puVar16 = (unqlite_kv_engine *)((long)&puVar15->pIo + 2);
        if (puVar12 <= puVar16) break;
        *(undefined1 *)&puVar16->pIo = 0;
        puVar16 = (unqlite_kv_engine *)((long)&puVar15->pIo + 3);
        if (puVar12 <= puVar16) break;
        *(undefined1 *)&puVar16->pIo = 0;
        puVar15 = (unqlite_kv_engine *)((long)&puVar15->pIo + 4);
      } while (puVar15 < puVar12);
    }
    puVar2->pIo = puVar4;
    p_Var6 = puVar4->pMethods->xInit;
    if (((p_Var6 != (_func_int_unqlite_kv_engine_ptr_int *)0x0) &&
        (iVar9 = (*p_Var6)(puVar2,pPager->iPageSize), iVar9 != 0)) ||
       ((p_Var7 = puVar4->pMethods->xOpen, p_Var7 != (_func_int_unqlite_kv_engine_ptr_pgno *)0x0 &&
        (iVar9 = (*p_Var7)(puVar2,pPager->dbSize), iVar9 != 0)))) goto LAB_0010ee1a;
  }
  iVar9 = 0;
LAB_0010ee1a:
  iVar17 = 0;
  if (iVar9 != 0) {
    pDb = pPager->pDb;
    psVar1 = &pDb->iFlags;
    *psVar1 = *psVar1 | 1;
    unqliteGenError(pDb,"Error while reseting pager to its initial state");
    iVar17 = iVar9;
  }
  return iVar17;
}

Assistant:

UNQLITE_PRIVATE int unqlitePagerRollback(Pager *pPager,int bResetKvEngine)
{
	int rc = UNQLITE_OK;
	if( pPager->iState < PAGER_WRITER_LOCKED ){
		/* A write transaction must be opened */
		return UNQLITE_OK;
	}
	if( pPager->is_mem ){
		/* As of this release 1.1.6: Transactions are not supported for in-memory databases */
		return UNQLITE_OK;
	}
	if( pPager->is_rdonly ){
		/* Read-Only DB */
		unqliteGenError(pPager->pDb,"Read-Only database");
		return UNQLITE_READ_ONLY;
	}
	if( pPager->iState >= PAGER_WRITER_CACHEMOD ){
		if( !pPager->no_jrnl ){
			/* Close any outstanding joural file */
			if( pPager->pjfd ){
				/* Sync the journal file */
				unqliteOsSync(pPager->pjfd,UNQLITE_SYNC_NORMAL);
			}
			unqliteOsCloseFree(pPager->pAllocator,pPager->pjfd);
			pPager->pjfd = 0;
			if( pPager->iFlags & (PAGER_CTRL_COMMIT_ERR|PAGER_CTRL_DIRTY_COMMIT) ){
				/* Perform the rollback */
				rc = pager_journal_rollback(pPager,0);
				if( rc != UNQLITE_OK ){
					/* Set the auto-commit flag */
					pPager->pDb->iFlags |= UNQLITE_FL_DISABLE_AUTO_COMMIT;
					return rc;
				}
			}
		}
		/* Unlink the journal file */
		unqliteOsDelete(pPager->pVfs,pPager->zJournal,1);
		/* Reset the pager state */
		rc = pager_reset_state(pPager,bResetKvEngine);
		if( rc != UNQLITE_OK ){
			/* Mostly an unlikely scenario */
			pPager->pDb->iFlags |= UNQLITE_FL_DISABLE_AUTO_COMMIT; /* Set the auto-commit flag */
			unqliteGenError(pPager->pDb,"Error while reseting pager to its initial state");
			return rc;
		}
	}else{
		/* Downgrade to shared lock */
		pager_unlock_db(pPager,SHARED_LOCK);
		pPager->iState = PAGER_READER;
	}
	return UNQLITE_OK;
}